

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_erase(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pMap;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 1) {
    jx9_result_bool(pCtx,0);
  }
  else {
    jx9HashmapRelease((jx9_hashmap *)((*apArg)->x).pOther,0);
  }
  return 0;
}

Assistant:

static int jx9_hashmap_erase(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	if( nArg < 1 ){
		/* Missing arguments */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target hashmap */
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	/* Erase */
	jx9HashmapRelease(pMap, FALSE);
	return JX9_OK;
}